

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O0

void __thiscall
duckdb::AlpRDScanState<float>::AlpRDScanState(AlpRDScanState<float> *this,ColumnSegment *segment)

{
  uchar uVar1;
  uint uVar2;
  _func_int **pp_Var3;
  data_ptr_t pdVar4;
  idx_t iVar5;
  ColumnSegment *in_RSI;
  SegmentScanState *in_RDI;
  uint8_t actual_dictionary_size_bytes;
  uint8_t actual_dictionary_size;
  uint metadata_offset;
  BufferManager *buffer_manager;
  BufferHandle *this_00;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff98;
  BufferHandle *in_stack_ffffffffffffffa0;
  BufferHandle local_40;
  BufferManager *local_28;
  ColumnSegment *local_10;
  
  local_10 = in_RSI;
  SegmentScanState::SegmentScanState(in_RDI);
  in_RDI->_vptr_SegmentScanState = (_func_int **)&PTR__AlpRDScanState_03510620;
  BufferHandle::BufferHandle(in_stack_ffffffffffffffa0);
  in_RDI[6]._vptr_SegmentScanState = (_func_int **)0x0;
  in_RDI[0xc0b]._vptr_SegmentScanState = (_func_int **)local_10;
  pp_Var3 = (_func_int **)
            ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff98);
  in_RDI[0xc0c]._vptr_SegmentScanState = pp_Var3;
  local_28 = BufferManager::GetBufferManager((DatabaseInstance *)0xab48b4);
  (*local_28->_vptr_BufferManager[7])(&local_40,local_28,&local_10->block);
  this_00 = (BufferHandle *)(in_RDI + 1);
  BufferHandle::operator=(this_00,&local_40);
  BufferHandle::~BufferHandle(this_00);
  pdVar4 = BufferHandle::Ptr((BufferHandle *)0xab4915);
  iVar5 = ColumnSegment::GetBlockOffset(local_10);
  in_RDI[5]._vptr_SegmentScanState = (_func_int **)(pdVar4 + iVar5);
  uVar2 = Load<unsigned_int>((const_data_ptr_t)in_RDI[5]._vptr_SegmentScanState);
  in_RDI[4]._vptr_SegmentScanState =
       (_func_int **)((long)in_RDI[5]._vptr_SegmentScanState + (ulong)uVar2);
  uVar1 = Load<unsigned_char>((const_data_ptr_t)((long)in_RDI[5]._vptr_SegmentScanState + 4));
  *(uchar *)((long)&in_RDI[0xc08]._vptr_SegmentScanState + 2) = uVar1;
  uVar1 = Load<unsigned_char>((const_data_ptr_t)((long)in_RDI[5]._vptr_SegmentScanState + 5));
  *(uchar *)((long)&in_RDI[0xc08]._vptr_SegmentScanState + 3) = uVar1;
  uVar1 = Load<unsigned_char>((const_data_ptr_t)((long)in_RDI[5]._vptr_SegmentScanState + 6));
  memcpy((void *)((long)&in_RDI[0xc08]._vptr_SegmentScanState + 4),
         (void *)((long)in_RDI[5]._vptr_SegmentScanState + 7),(ulong)(byte)(uVar1 << 1));
  return;
}

Assistant:

explicit AlpRDScanState(ColumnSegment &segment) : segment(segment), count(segment.count) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);

		handle = buffer_manager.Pin(segment.block);
		// ScanStates never exceed the boundaries of a Segment,
		// but are not guaranteed to start at the beginning of the Block
		segment_data = handle.Ptr() + segment.GetBlockOffset();
		auto metadata_offset = Load<uint32_t>(segment_data);
		metadata_ptr = segment_data + metadata_offset;

		// Load the Right Bit Width which is in the segment header after the pointer to the first metadata
		vector_state.right_bit_width = Load<uint8_t>(segment_data + AlpRDConstants::METADATA_POINTER_SIZE);
		vector_state.left_bit_width =
		    Load<uint8_t>(segment_data + AlpRDConstants::METADATA_POINTER_SIZE + AlpRDConstants::RIGHT_BIT_WIDTH_SIZE);

		uint8_t actual_dictionary_size =
		    Load<uint8_t>(segment_data + AlpRDConstants::METADATA_POINTER_SIZE + AlpRDConstants::RIGHT_BIT_WIDTH_SIZE +
		                  AlpRDConstants::LEFT_BIT_WIDTH_SIZE);
		uint8_t actual_dictionary_size_bytes = actual_dictionary_size * AlpRDConstants::DICTIONARY_ELEMENT_SIZE;

		// Load the left parts dictionary which is after the segment header and is of a fixed size
		memcpy(vector_state.left_parts_dict, (void *)(segment_data + AlpRDConstants::HEADER_SIZE),
		       actual_dictionary_size_bytes);
	}